

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

ssize_t __thiscall r_comp::Class::write(Class *this,int __fd,void *__buf,size_t __n)

{
  pointer pSVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  size_t __n_00;
  void *__buf_00;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  undefined4 *puVar5;
  iterator __end1;
  iterator __begin1;
  pointer this_00;
  
  puVar5 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  *puVar5 = *(undefined4 *)this;
  r_code::WriteString(puVar5 + 1,(string *)&this->str_opcode);
  lVar2 = r_code::GetStringSize((string *)&this->str_opcode);
  *(undefined8 *)(puVar5 + lVar2 + 1) = *(undefined8 *)&this->type;
  this_00 = (this->things_to_read).
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->things_to_read).
           super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pSVar1 - (long)this_00;
  __n_00 = 0x60;
  sVar4 = lVar3 / 0x60;
  __buf_00 = (void *)(lVar3 % 0x60);
  puVar5[lVar2 + 3] = (int)sVar4;
  lVar2 = lVar2 + 4;
  for (; this_00 != pSVar1; this_00 = this_00 + 1) {
    StructureMember::write(this_00,__fd + (int)lVar2 * 4,__buf_00,__n_00);
    sVar4 = StructureMember::get_size(this_00);
    lVar2 = lVar2 + sVar4;
    __buf_00 = extraout_RDX;
  }
  return sVar4;
}

Assistant:

void Class::write(uint32_t *storage)
{
    storage[0] = atom.atom;
    r_code::WriteString(storage + 1, str_opcode);
    uint64_t offset = 1 + r_code::GetStringSize(str_opcode);
    storage[offset++] = type;
    storage[offset++] = use_as;
    storage[offset++] = things_to_read.size();

    for (StructureMember &member : things_to_read) {
        member.write(storage + offset);
        offset += member.get_size();
    }
}